

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.h
# Opt level: O0

vector<Point2D,_std::allocator<Point2D>_> * __thiscall
lazyTrees::LazyKdTree<Point2D>::in_box(LazyKdTree<Point2D> *this,Point2D *search,Point2D *sizes)

{
  bool bVar1;
  bool bVar2;
  Compare CVar3;
  Point2D *pPVar4;
  double *pdVar5;
  size_t sVar6;
  vector<Point2D,_std::allocator<Point2D>_> *this_00;
  Point2D *in_RCX;
  LazyKdTree<Point2D> *in_RDX;
  vector<Point2D,_std::allocator<Point2D>_> *in_RDI;
  double dVar7;
  double dVar8;
  double borderPositive;
  double borderNegative;
  Compare comp;
  size_t i_1;
  bool inBox;
  size_t i;
  vector<Point2D,_std::allocator<Point2D>_> *res;
  size_t in_stack_fffffffffffffe98;
  LazyKdTree<Point2D> *in_stack_fffffffffffffea0;
  Point2D *in_stack_fffffffffffffea8;
  Point2D *in_stack_fffffffffffffeb0;
  Point2D *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffef0;
  Compare CVar9;
  LazyKdTree<Point2D> *in_stack_ffffffffffffff40;
  ulong local_38;
  Point2D *pPVar10;
  Point2D *sizes_00;
  LazyKdTree<Point2D> *this_01;
  
  ensure_evaluated(in_stack_ffffffffffffff40);
  pPVar10 = (Point2D *)0x0;
  while( true ) {
    sizes_00 = pPVar10;
    pPVar4 = (Point2D *)Point2D::dimensions();
    if (pPVar4 <= pPVar10) {
      std::vector<Point2D,_std::allocator<Point2D>_>::vector
                ((vector<Point2D,_std::allocator<Point2D>_> *)0x1b2c64);
      bVar2 = true;
      local_38 = 0;
      while( true ) {
        sVar6 = Point2D::dimensions();
        bVar1 = false;
        if (local_38 < sVar6) {
          bVar1 = bVar2;
        }
        if (!bVar1) break;
        std::unique_ptr<Point2D,_std::default_delete<Point2D>_>::get
                  ((unique_ptr<Point2D,_std::default_delete<Point2D>_> *)in_stack_fffffffffffffea0);
        dVar7 = dimension_dist(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                               (size_t)in_stack_fffffffffffffea0);
        pdVar5 = Point2D::operator[](in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
        bVar2 = dVar7 <= *pdVar5 * 0.5;
        local_38 = local_38 + 1;
      }
      if (bVar2) {
        std::unique_ptr<Point2D,_std::default_delete<Point2D>_>::get
                  ((unique_ptr<Point2D,_std::default_delete<Point2D>_> *)in_stack_fffffffffffffea0);
        std::vector<Point2D,_std::allocator<Point2D>_>::push_back
                  ((vector<Point2D,_std::allocator<Point2D>_> *)in_stack_fffffffffffffeb0,
                   in_stack_fffffffffffffea8);
      }
      bVar2 = is_leaf(in_stack_fffffffffffffea0);
      if (!bVar2) {
        this_01 = in_RDX;
        std::unique_ptr<Point2D,_std::default_delete<Point2D>_>::get
                  ((unique_ptr<Point2D,_std::default_delete<Point2D>_> *)in_stack_fffffffffffffea0);
        CVar3 = dimension_compare(in_stack_fffffffffffffea8,(Point2D *)in_stack_fffffffffffffea0,
                                  in_stack_fffffffffffffe98);
        CVar9 = CVar3;
        if (CVar3 == NEGATIVE) {
          bVar2 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                              *)0x1b2e2f);
          if (bVar2) {
            std::
            unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
            ::operator->((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                          *)0x1b2e46);
            in_box(this_01,in_RCX,sizes_00);
            move_append((vector<Point2D,_std::allocator<Point2D>_> *)
                        CONCAT44(CVar9,in_stack_fffffffffffffef0),
                        (vector<Point2D,_std::allocator<Point2D>_> *)in_RDX);
            std::vector<Point2D,_std::allocator<Point2D>_>::~vector
                      ((vector<Point2D,_std::allocator<Point2D>_> *)in_stack_fffffffffffffeb0);
          }
        }
        else {
          bVar2 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                              *)0x1b2eca);
          if (bVar2) {
            std::
            unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
            ::operator->((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                          *)0x1b2ee1);
            in_box(this_01,in_RCX,sizes_00);
            move_append((vector<Point2D,_std::allocator<Point2D>_> *)
                        CONCAT44(CVar9,in_stack_fffffffffffffef0),
                        (vector<Point2D,_std::allocator<Point2D>_> *)in_RDX);
            std::vector<Point2D,_std::allocator<Point2D>_>::~vector
                      ((vector<Point2D,_std::allocator<Point2D>_> *)in_stack_fffffffffffffeb0);
          }
        }
        pdVar5 = Point2D::operator[](in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
        dVar7 = *pdVar5;
        pdVar5 = Point2D::operator[](in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
        dVar7 = *pdVar5 * -0.5 + dVar7;
        pdVar5 = Point2D::operator[](in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
        pPVar10 = (Point2D *)*pdVar5;
        pdVar5 = Point2D::operator[](pPVar10,(size_t)in_stack_fffffffffffffeb0);
        dVar8 = *pdVar5 * 0.5 + (double)pPVar10;
        if ((CVar3 == NEGATIVE) &&
           (bVar2 = std::unique_ptr::operator_cast_to_bool
                              ((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                                *)0x1b305e), bVar2)) {
          std::unique_ptr<Point2D,_std::default_delete<Point2D>_>::get
                    ((unique_ptr<Point2D,_std::default_delete<Point2D>_> *)in_stack_fffffffffffffea0
                    );
          this_00 = (vector<Point2D,_std::allocator<Point2D>_> *)
                    Point2D::operator[](pPVar10,(size_t)in_stack_fffffffffffffeb0);
          if ((double)(this_00->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
                      super__Vector_impl_data._M_start <= dVar8) {
            std::
            unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
            ::operator->((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                          *)0x1b30c4);
            in_box(this_01,in_RCX,sizes_00);
            move_append((vector<Point2D,_std::allocator<Point2D>_> *)
                        CONCAT44(CVar9,in_stack_fffffffffffffef0),
                        (vector<Point2D,_std::allocator<Point2D>_> *)in_RDX);
            std::vector<Point2D,_std::allocator<Point2D>_>::~vector(this_00);
          }
        }
        else if ((CVar3 == POSITIVE) &&
                (bVar2 = std::unique_ptr::operator_cast_to_bool
                                   ((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                                     *)0x1b3156), bVar2)) {
          std::unique_ptr<Point2D,_std::default_delete<Point2D>_>::get
                    ((unique_ptr<Point2D,_std::default_delete<Point2D>_> *)in_stack_fffffffffffffea0
                    );
          pdVar5 = Point2D::operator[](pPVar10,(size_t)in_stack_fffffffffffffeb0);
          if (dVar7 <= *pdVar5) {
            std::
            unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
            ::operator->((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                          *)0x1b31be);
            in_box(this_01,in_RCX,sizes_00);
            move_append((vector<Point2D,_std::allocator<Point2D>_> *)
                        CONCAT44(CVar9,in_stack_fffffffffffffef0),
                        (vector<Point2D,_std::allocator<Point2D>_> *)in_RDX);
            std::vector<Point2D,_std::allocator<Point2D>_>::~vector
                      ((vector<Point2D,_std::allocator<Point2D>_> *)in_stack_fffffffffffffeb0);
          }
        }
      }
      return in_RDI;
    }
    pdVar5 = Point2D::operator[](in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
    if (*pdVar5 <= 0.0) break;
    pPVar10 = (Point2D *)((long)&sizes_00->x + 1);
  }
  memset(in_RDI,0,0x18);
  std::vector<Point2D,_std::allocator<Point2D>_>::vector
            ((vector<Point2D,_std::allocator<Point2D>_> *)0x1b2c2f);
  return in_RDI;
}

Assistant:

std::vector<P> in_box(P const& search, P const& sizes)
    {
        ensure_evaluated();

        for (size_t i = 0; i < P::dimensions(); ++i) {
            if (sizes[i] <= 0.0)
                return std::vector<P>(); // no real search if one dimension size is <= 0
        }

        std::vector<P> res; // all points within the box

        bool inBox = true;
        for (size_t i = 0; i < P::dimensions() && inBox; ++i)
            inBox = dimension_dist(search, *(data.get()), i) <= 0.5 * sizes[i];

        if (inBox) res.push_back(*(data.get()));

        if (is_leaf()) return res; // no children, return result

        // decide which side to check and recurse into it
        const auto comp = dimension_compare(search, *(data.get()), dim);
        if (comp == NEGATIVE) {
            if (childNegative)
                move_append(childNegative->in_box(search, sizes), res);
        } else if (childPositive) {
            move_append(childPositive->in_box(search, sizes), res);
        }

        const double borderNegative = search[dim] - 0.5 * sizes[dim];
        const double borderPositive = search[dim] + 0.5 * sizes[dim];

        // check whether distances to other side are smaller than radius
        // and recurse into the "wrong" direction, to check for possibly additional
        // candidates
        if (comp == NEGATIVE && childPositive) {
            if (borderPositive >= (*data.get())[dim])
                move_append(childPositive->in_box(search, sizes), res);
        } else if (comp == POSITIVE && childNegative) {
            if (borderNegative <= (*data.get())[dim])
                move_append(childNegative->in_box(search, sizes), res);
        }

        return res;
    }